

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O3

exr_result_t update_pack_unpack_ptrs(exr_decode_pipeline_t *decode)

{
  exr_result_t eVar1;
  size_t sVar2;
  
  if (((decode->chunk).type & 0xfe) == 2) {
    sVar2 = ((ulong)(decode->decode_flags & 1) +
            (long)(decode->chunk).height * (long)(decode->chunk).width) * 4;
    if ((decode->chunk).sample_count_table_size == sVar2) {
      internal_decode_free_buffer
                (decode,EXR_TRANSCODE_BUFFER_SAMPLES,&decode->sample_count_table,
                 &decode->sample_count_alloc_size);
      decode->sample_count_table = (int32_t *)decode->packed_sample_count_table;
    }
    else {
      eVar1 = internal_decode_alloc_buffer
                        (decode,EXR_TRANSCODE_BUFFER_SAMPLES,&decode->sample_count_table,
                         &decode->sample_count_alloc_size,sVar2);
      if (eVar1 != 0) {
        return eVar1;
      }
    }
    if ((decode->decode_flags & 4) != 0) {
      return 0;
    }
  }
  sVar2 = (decode->chunk).unpacked_size;
  if ((decode->chunk).packed_size == sVar2) {
    internal_decode_free_buffer
              (decode,EXR_TRANSCODE_BUFFER_UNPACKED,&decode->unpacked_buffer,
               &decode->unpacked_alloc_size);
    decode->unpacked_buffer = decode->packed_buffer;
    return 0;
  }
  eVar1 = internal_decode_alloc_buffer
                    (decode,EXR_TRANSCODE_BUFFER_UNPACKED,&decode->unpacked_buffer,
                     &decode->unpacked_alloc_size,sVar2);
  return eVar1;
}

Assistant:

OPENEXR_CORE_INTERNAL_NAMESPACE_SOURCE_ENTER

/**************************************/

static exr_result_t
update_pack_unpack_ptrs (exr_decode_pipeline_t* decode)
{
    exr_result_t  rv;
    exr_storage_t stortype = ((exr_storage_t) decode->chunk.type);

    if (stortype == EXR_STORAGE_DEEP_SCANLINE ||
        stortype == EXR_STORAGE_DEEP_TILED)
    {
        size_t sampsize =
            (((size_t) decode->chunk.width) * ((size_t) decode->chunk.height));

        if ((decode->decode_flags & EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
            sampsize += 1;
        sampsize *= sizeof (int32_t);

        if (decode->chunk.sample_count_table_size == sampsize)
        {
            internal_decode_free_buffer (
                decode,
                EXR_TRANSCODE_BUFFER_SAMPLES,
                (void**) &(decode->sample_count_table),
                &(decode->sample_count_alloc_size));

            decode->sample_count_table = (int32_t*) decode->packed_sample_count_table;
            rv                         = EXR_ERR_SUCCESS;
        }
        else
        {
            rv = internal_decode_alloc_buffer (
                decode,
                EXR_TRANSCODE_BUFFER_SAMPLES,
                (void**) &(decode->sample_count_table),
                &(decode->sample_count_alloc_size),
                sampsize);
        }

        if (rv != EXR_ERR_SUCCESS ||
            (decode->decode_flags & EXR_DECODE_SAMPLE_DATA_ONLY) != 0)
            return rv;
    }

    if (decode->chunk.packed_size == decode->chunk.unpacked_size)
    {
        internal_decode_free_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_UNPACKED,
            (void**) &(decode->unpacked_buffer),
            &(decode->unpacked_alloc_size));

        decode->unpacked_buffer = decode->packed_buffer;
        rv                      = EXR_ERR_SUCCESS;
    }
    else
    {
        rv = internal_decode_alloc_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_UNPACKED,
            (void**) &(decode->unpacked_buffer),
            &(decode->unpacked_alloc_size),
            decode->chunk.unpacked_size);
    }

    return rv;
}